

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetIntegerVerifier::
verifyIntegerGreaterOrEqual2
          (GetIntegerVerifier *this,TestContext *testCtx,GLenum name,GLint reference0,
          GLint reference1)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<int[2]> intVector2;
  StateQueryMemoryWriteGuard<int[2]> local_1b8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  local_1b8.m_postguard[0] = -0x21212122;
  local_1b8.m_postguard[1] = -0x21212122;
  local_1b8.m_preguard[0] = -0x21212122;
  local_1b8.m_preguard[1] = -0x21212122;
  local_1b8.m_value[0] = -0x21212122;
  local_1b8.m_value[1] = -0x21212122;
  glu::CallLogWrapper::glGetIntegerv
            (&(this->super_StateVerifier).super_CallLogWrapper,name,local_1b8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int[2]>::verifyValidity
                    (&local_1b8,testCtx);
  if ((bVar1) && ((local_1b8.m_value[0] < reference0 || (local_1b8.m_value[1] < reference1)))) {
    local_1a0._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected greater or equal to ",0x27);
    std::ostream::operator<<(this_00,reference0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,reference1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
    std::ostream::operator<<(this_00,local_1b8.m_value[0]);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
    std::ostream::operator<<(this_00,local_1b8.m_value[0]);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetIntegerVerifier::verifyIntegerGreaterOrEqual2 (tcu::TestContext& testCtx, GLenum name, GLint reference0, GLint reference1)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint[2]> intVector2;
	glGetIntegerv(name, intVector2);

	if (!intVector2.verifyValidity(testCtx))
		return;

	if (intVector2[0] < reference0 || intVector2[1] < reference1)
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected greater or equal to " << reference0 << ", " << reference1 << "; got " << intVector2[0] << ", " << intVector2[0] << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}